

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O2

nhdp_neighbor * nhdp_db_neighbor_add(void)

{
  list_entity **pplVar1;
  nhdp_neighbor *neigh;
  
  neigh = (nhdp_neighbor *)oonf_class_malloc(&_neigh_info);
  if (neigh != (nhdp_neighbor *)0x0) {
    if ((log_global_mask[LOG_NHDP] & 1) != 0) {
      oonf_log(LOG_SEVERITY_DEBUG,LOG_NHDP,"src/nhdp/nhdp/nhdp_db.c",0xd0,(void *)0x0,0,
               "New Neighbor: 0x%0zx",neigh);
    }
    avl_init(&neigh->_neigh_addresses,avl_comp_netaddr,false);
    avl_init(&neigh->_link_addresses,avl_comp_netaddr,true);
    (neigh->_links).prev = &neigh->_links;
    (neigh->_links).next = &neigh->_links;
    (neigh->_global_node).next = &_neigh_list;
    (neigh->_global_node).prev = _neigh_list.prev;
    pplVar1 = &(_neigh_list.prev)->next;
    _neigh_list.prev = &neigh->_global_node;
    *pplVar1 = &neigh->_global_node;
    (neigh->_originator_node).key = neigh;
    nhdp_domain_init_neighbor(neigh);
    oonf_class_event(&_neigh_info,neigh,OONF_OBJECT_ADDED);
  }
  return neigh;
}

Assistant:

struct nhdp_neighbor *
nhdp_db_neighbor_add(void) {
  struct nhdp_neighbor *neigh;

  neigh = oonf_class_malloc(&_neigh_info);
  if (neigh == NULL) {
    return NULL;
  }

  OONF_DEBUG(LOG_NHDP, "New Neighbor: 0x%0zx", (size_t)neigh);

  /* initialize trees and lists */
  avl_init(&neigh->_neigh_addresses, avl_comp_netaddr, false);
  avl_init(&neigh->_link_addresses, avl_comp_netaddr, true);
  list_init_head(&neigh->_links);

  /* hook into global neighbor list */
  list_add_tail(&_neigh_list, &neigh->_global_node);

  /* initialize originator node */
  neigh->_originator_node.key = &neigh->originator;

  /* initialize domain data */
  nhdp_domain_init_neighbor(neigh);

  /* trigger event */
  oonf_class_event(&_neigh_info, neigh, OONF_OBJECT_ADDED);
  return neigh;
}